

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

Type metaf::CloudType::cloudTypeOrObscurationFromString(string *s)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Type t;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  local_4 = cloudTypeFromString((string *)
                                CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (local_4 == NOT_REPORTED) {
    bVar1 = std::operator==(in_RDI,(char *)(ulong)in_stack_ffffffffffffffe8);
    if (bVar1) {
      local_4 = BLOWING_SNOW;
    }
    else {
      bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,in_stack_ffffffffffffffe8));
      if (bVar1) {
        local_4 = BLOWING_DUST;
      }
      else {
        bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,in_stack_ffffffffffffffe8));
        if (bVar1) {
          local_4 = BLOWING_SAND;
        }
        else {
          bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,in_stack_ffffffffffffffe8));
          if (bVar1) {
            local_4 = ICE_CRYSTALS;
          }
          else {
            bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,in_stack_ffffffffffffffe8));
            if (bVar1) {
              local_4 = RAIN;
            }
            else {
              bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,in_stack_ffffffffffffffe8));
              if (bVar1) {
                local_4 = DRIZZLE;
              }
              else {
                bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,in_stack_ffffffffffffffe8));
                if (bVar1) {
                  local_4 = SNOW;
                }
                else {
                  bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,in_stack_ffffffffffffffe8)
                                         );
                  if (bVar1) {
                    local_4 = ICE_PELLETS;
                  }
                  else {
                    bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,
                                                  in_stack_ffffffffffffffe8));
                    if (bVar1) {
                      local_4 = SMOKE;
                    }
                    else {
                      bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,
                                                  in_stack_ffffffffffffffe8));
                      if (bVar1) {
                        local_4 = FOG;
                      }
                      else {
                        bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,
                                                  in_stack_ffffffffffffffe8));
                        if (bVar1) {
                          local_4 = MIST;
                        }
                        else {
                          bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,
                                                  in_stack_ffffffffffffffe8));
                          if (bVar1) {
                            local_4 = HAZE;
                          }
                          else {
                            bVar1 = std::operator==(in_RDI,(char *)CONCAT44(local_4,
                                                  in_stack_ffffffffffffffe8));
                            if (bVar1) {
                              local_4 = VOLCANIC_ASH;
                            }
                            else {
                              local_4 = NOT_REPORTED;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

CloudType::Type CloudType::cloudTypeOrObscurationFromString(const std::string & s) {
	if (const auto t = cloudTypeFromString(s); t != Type::NOT_REPORTED) return t;
	if (s == "BLSN")  return Type::BLOWING_SNOW;
	if (s == "BLDU")  return Type::BLOWING_DUST;
	if (s == "BLSA")  return Type::BLOWING_SAND;
	if (s == "IC")    return Type::ICE_CRYSTALS;
	if (s == "RA")    return Type::RAIN;
	if (s == "DZ")    return Type::DRIZZLE;
	if (s == "SN")    return Type::SNOW;
	if (s == "PL")    return Type::ICE_PELLETS;
	if (s == "FU")    return Type::SMOKE;
	if (s == "FG")    return Type::FOG;
	if (s == "BR")    return Type::MIST;
	if (s == "HZ")    return Type::HAZE;
	if (s == "VA") 	  return Type::VOLCANIC_ASH;
	return Type::NOT_REPORTED;
}